

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BufferObjectQueryTests::~BufferObjectQueryTests
          (BufferObjectQueryTests *this)

{
  ~BufferObjectQueryTests(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

BufferObjectQueryTests::~BufferObjectQueryTests (void)
{
	deinit();
}